

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O1

bool Clasp::ClauseCreator::ignoreClause(Solver *s,ClauseRep *c,Status st,uint32 flags)

{
  bool bVar1;
  
  if ((st & (status_unsat|status_sat)) == status_open) {
    return false;
  }
  if ((st & (status_unsat|status_sat)) == status_unsat) {
    bVar1 = (bool)((byte)((flags & 0x10) >> 4) & st != status_empty);
  }
  else {
    bVar1 = true;
    if (st != status_subsumed) {
      if (st == status_sat) {
        if ((flags & 4) != 0) {
          return true;
        }
        if ((flags & 8) != 0) {
          return *(uint *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(c->lits->rep_ & 0xfffffffc)
                          ) >> 4 <= (s->levels_).root;
        }
      }
      return false;
    }
  }
  return bVar1;
}

Assistant:

bool ClauseCreator::ignoreClause(const Solver& s, const ClauseRep& c, Status st, uint32 flags) {
	uint32 x = (st & (status_sat|status_unsat));
	if (x == status_open)  { return false; }
	if (x == status_unsat) { return st != status_empty && (flags & clause_not_conflict) != 0; }
	return st == status_subsumed || (st == status_sat && ( (flags & clause_not_sat) != 0 || ((flags & clause_not_root_sat) != 0 && s.level(c.lits[0].var()) <= s.rootLevel())));
}